

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  uint8_t uVar4;
  char cVar5;
  size_t sVar6;
  size_t sVar7;
  BrotliEncoderDictionary *pBVar8;
  uint32_t *puVar9;
  HasherCommon *pHVar10;
  BrotliDictionary *pBVar11;
  int iVar12;
  ushort uVar13;
  int iVar14;
  uint32_t uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  byte bVar23;
  bool bVar24;
  uint16_t uVar25;
  size_t sVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  ulong *puVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong *puVar46;
  uint uVar47;
  int local_14c;
  ulong local_138;
  Command *local_108;
  uint local_fc;
  ulong local_e0;
  ulong local_d8;
  ulong local_b0;
  ulong local_a0;
  uint local_78;
  uint8_t *s1_orig_1;
  uint8_t *s1_orig;
  
  uVar18 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar3 = (position - 7) + num_bytes;
  sVar26 = position;
  if (7 < num_bytes) {
    sVar26 = uVar3;
  }
  lVar27 = 0x200;
  if (params->quality < 9) {
    lVar27 = 0x40;
  }
  uVar1 = position + num_bytes;
  sVar6 = params->stream_offset;
  uVar45 = *last_insert_len;
  uVar40 = lVar27 + position;
  sVar7 = (params->dictionary).compound.total_size;
  lVar19 = sVar7 + 1;
  local_108 = commands;
  do {
LAB_01e35aad:
    uVar22 = position;
    if (uVar1 <= uVar22 + 8) {
      *last_insert_len = (uVar45 + uVar1) - uVar22;
      *num_commands = *num_commands + ((long)local_108 - (long)commands >> 4);
      return;
    }
    uVar30 = uVar18;
    if (uVar22 < uVar18) {
      uVar30 = uVar22;
    }
    uVar28 = sVar6 + uVar22;
    if (uVar18 <= sVar6 + uVar22) {
      uVar28 = uVar18;
    }
    if ((params->dictionary).contextual.context_based == 0) {
      local_fc = 0;
      local_b0 = 0;
    }
    else {
      if (uVar22 == 0) {
        local_b0 = 0;
LAB_01e35b2e:
        uVar20 = 0;
      }
      else {
        local_b0 = (ulong)ringbuffer[uVar22 - 1 & ringbuffer_mask];
        if (uVar22 == 1) goto LAB_01e35b2e;
        uVar20 = (ulong)ringbuffer[uVar22 - 2 & ringbuffer_mask];
      }
      local_fc = (uint)(params->dictionary).contextual.context_map
                       [literal_context_lut[uVar20 + 0x100] | literal_context_lut[local_b0]];
    }
    uVar43 = uVar1 - uVar22;
    pBVar8 = (params->dictionary).contextual.dict[local_fc];
    uVar20 = (params->dist).max_distance;
    puVar9 = (hasher->privat)._H2.buckets_;
    uVar21 = uVar22 & ringbuffer_mask;
    puVar2 = (ulong *)(ringbuffer + uVar21);
    uVar4 = ringbuffer[uVar21];
    uVar41 = (ulong)(*(long *)(ringbuffer + uVar21) * 0x7bd3579bd3000000) >> 0x30;
    uVar21 = (ulong)*dist_cache;
    local_78 = (uint)ringbuffer_mask;
    if ((uVar22 <= uVar22 - uVar21) ||
       (uVar38 = (uint)(uVar22 - uVar21) & local_78, uVar4 != ringbuffer[uVar38])) {
LAB_01e35c50:
      uVar38 = puVar9[uVar41];
      puVar9[uVar41] = (uint32_t)uVar22;
      if ((uVar4 == ringbuffer[local_78 & uVar38]) &&
         ((uVar22 != uVar38 && (uVar21 = uVar22 - uVar38, uVar21 <= uVar30)))) {
        puVar39 = (ulong *)(ringbuffer + (local_78 & uVar38));
        lVar44 = 0;
        uVar30 = uVar43;
        puVar46 = puVar2;
LAB_01e35c94:
        if (uVar30 < 8) {
          for (uVar32 = 0;
              (uVar30 != uVar32 &&
              (*(char *)((long)puVar39 + uVar32) == *(char *)((long)puVar46 + uVar32)));
              uVar32 = uVar32 + 1) {
          }
        }
        else {
          if (*puVar46 == *puVar39) goto code_r0x01e35ca5;
          uVar41 = *puVar39 ^ *puVar46;
          uVar30 = 0;
          if (uVar41 != 0) {
            for (; (uVar41 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          uVar32 = uVar30 >> 3 & 0x1fffffff;
        }
        uVar32 = uVar32 - lVar44;
        if (3 < uVar32) {
          iVar17 = 0x1f;
          if ((uint)uVar21 != 0) {
            for (; (uint)uVar21 >> iVar17 == 0; iVar17 = iVar17 + -1) {
            }
          }
          local_e0 = (ulong)(iVar17 * -0x1e + 0x780) + uVar32 * 0x87;
          if (0x7e4 < local_e0) goto LAB_01e35fc2;
        }
        pHVar10 = (hasher->privat)._H2.common;
        uVar30 = pHVar10->dict_num_lookups;
        local_138 = pHVar10->dict_num_matches;
        if (uVar30 >> 7 <= local_138) {
          uVar41 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          bVar24 = true;
          uVar21 = 0;
          local_e0 = 0x7e4;
          uVar32 = 0;
          local_14c = 0;
          while (bVar24) {
            uVar30 = uVar30 + 1;
            pHVar10->dict_num_lookups = uVar30;
            bVar23 = pBVar8->hash_table_lengths[uVar41];
            uVar29 = (ulong)bVar23;
            if ((uVar29 != 0) && (uVar29 <= uVar43)) {
              pBVar11 = pBVar8->words;
              puVar39 = (ulong *)(pBVar11->data +
                                 (ulong)pBVar11->offsets_by_length[uVar29] +
                                 pBVar8->hash_table_words[uVar41] * uVar29);
              lVar44 = 0;
              uVar33 = uVar29;
              puVar46 = puVar2;
LAB_01e35dde:
              if (uVar33 < 8) {
                for (uVar33 = 0;
                    ((bVar23 & 7) != uVar33 &&
                    (*(char *)((long)puVar46 + uVar33) == *(char *)((long)puVar39 + uVar33)));
                    uVar33 = uVar33 + 1) {
                }
              }
              else {
                if (*puVar39 == *puVar46) goto code_r0x01e35df0;
                uVar36 = *puVar46 ^ *puVar39;
                uVar33 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                  }
                }
                uVar33 = uVar33 >> 3 & 0x1fffffff;
              }
              uVar33 = uVar33 - lVar44;
              if (((uVar33 != 0) && (uVar29 < pBVar8->cutoffTransformsCount + uVar33)) &&
                 (uVar29 = (ulong)pBVar8->hash_table_words[uVar41] + uVar28 + lVar19 +
                           ((ulong)((uint)(pBVar8->cutoffTransforms >>
                                          ((char)(uVar29 - uVar33) * '\x06' & 0x3fU)) & 0x3f) +
                            (uVar29 - uVar33) * 4 << (pBVar11->size_bits_by_length[uVar29] & 0x3f)),
                 uVar29 <= uVar20)) {
                iVar17 = 0x1f;
                if ((uint)uVar29 != 0) {
                  for (; (uint)uVar29 >> iVar17 == 0; iVar17 = iVar17 + -1) {
                  }
                }
                uVar36 = (uVar33 * 0x87 - (ulong)(uint)(iVar17 * 0x1e)) + 0x780;
                if (local_e0 <= uVar36) {
                  local_14c = (uint)bVar23 - (int)uVar33;
                  local_138 = local_138 + 1;
                  pHVar10->dict_num_matches = local_138;
                  local_e0 = uVar36;
                  uVar32 = uVar33;
                  uVar21 = uVar29;
                }
              }
            }
            uVar41 = uVar41 + 1;
            bVar24 = false;
          }
          if (0x7e4 < local_e0) goto LAB_01e35fca;
        }
      }
      uVar45 = uVar45 + 1;
      position = uVar22 + 1;
      if (uVar40 < position) {
        if ((uint)((int)lVar27 * 4) + uVar40 < position) {
          uVar30 = uVar22 + 0x11;
          if (uVar3 <= uVar22 + 0x11) {
            uVar30 = uVar3;
          }
          for (; position < uVar30; position = position + 4) {
            puVar9[(ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) * 0x7bd3579bd3000000
                          ) >> 0x30] = (uint32_t)position;
            uVar45 = uVar45 + 4;
          }
        }
        else {
          uVar30 = uVar22 + 9;
          if (uVar3 <= uVar22 + 9) {
            uVar30 = uVar3;
          }
          for (; position < uVar30; position = position + 2) {
            puVar9[(ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) * 0x7bd3579bd3000000
                          ) >> 0x30] = (uint32_t)position;
            uVar45 = uVar45 + 2;
          }
        }
      }
      goto LAB_01e35aad;
    }
    puVar39 = (ulong *)(ringbuffer + uVar38);
    lVar44 = 0;
    uVar29 = uVar43;
    puVar46 = puVar2;
LAB_01e35be4:
    if (uVar29 < 8) {
      for (uVar32 = 0;
          (uVar29 != uVar32 &&
          (*(char *)((long)puVar39 + uVar32) == *(char *)((long)puVar46 + uVar32)));
          uVar32 = uVar32 + 1) {
      }
    }
    else {
      if (*puVar46 == *puVar39) break;
      uVar32 = *puVar39 ^ *puVar46;
      uVar29 = 0;
      if (uVar32 != 0) {
        for (; (uVar32 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
        }
      }
      uVar32 = uVar29 >> 3 & 0x1fffffff;
    }
    uVar32 = uVar32 - lVar44;
    if ((uVar32 < 4) || (local_e0 = uVar32 * 0x87 + 0x78f, local_e0 < 0x7e5)) goto LAB_01e35c50;
    puVar9[uVar41] = (uint32_t)uVar22;
LAB_01e35fc2:
    local_14c = 0;
LAB_01e35fca:
    iVar17 = *dist_cache;
    iVar14 = 0;
    uVar40 = uVar45;
    do {
      uVar43 = uVar43 - 1;
      uVar30 = uVar32 - 1;
      if (uVar43 <= uVar32 - 1) {
        uVar30 = uVar43;
      }
      if (4 < params->quality) {
        uVar30 = 0;
      }
      uVar28 = uVar22 + 1;
      uVar41 = uVar18;
      if (uVar28 < uVar18) {
        uVar41 = uVar28;
      }
      local_d8 = sVar6 + uVar22 + 1;
      if (uVar18 <= local_d8) {
        local_d8 = uVar18;
      }
      if ((params->dictionary).contextual.context_based != 0) {
        local_fc = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[local_b0 + 0x100] |
                          literal_context_lut[ringbuffer[uVar22 & ringbuffer_mask]]];
        local_b0 = (ulong)ringbuffer[uVar22 & ringbuffer_mask];
      }
      pBVar8 = (params->dictionary).contextual.dict[local_fc];
      puVar2 = (ulong *)(ringbuffer + (uVar28 & ringbuffer_mask));
      cVar5 = *(char *)(uVar30 + (long)puVar2);
      uVar29 = (ulong)(*(long *)(ringbuffer + (uVar28 & ringbuffer_mask)) * 0x7bd3579bd3000000) >>
               0x30;
      uVar33 = uVar28 - (long)iVar17;
      if ((uVar33 < uVar28) &&
         (puVar46 = (ulong *)(ringbuffer + ((uint)uVar33 & local_78)),
         cVar5 == *(char *)(uVar30 + (long)puVar46))) {
        lVar44 = 0;
        uVar33 = uVar43;
        puVar39 = puVar2;
LAB_01e3610e:
        if (uVar33 < 8) {
          for (uVar36 = 0;
              (uVar33 != uVar36 &&
              (*(char *)((long)puVar46 + uVar36) == *(char *)((long)puVar39 + uVar36)));
              uVar36 = uVar36 + 1) {
          }
        }
        else {
          if (*puVar39 == *puVar46) goto code_r0x01e3611f;
          uVar36 = *puVar46 ^ *puVar39;
          uVar33 = 0;
          if (uVar36 != 0) {
            for (; (uVar36 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
            }
          }
          uVar36 = uVar33 >> 3 & 0x1fffffff;
        }
        uVar36 = uVar36 - lVar44;
        if ((uVar36 < 4) || (uVar33 = uVar36 * 0x87 + 0x78f, uVar33 < 0x7e5)) goto LAB_01e36192;
        puVar9[uVar29] = (uint32_t)uVar28;
        uVar29 = (long)iVar17;
        uVar30 = uVar36;
LAB_01e36207:
        iVar31 = 0;
        uVar41 = uVar30;
      }
      else {
LAB_01e36192:
        uVar38 = puVar9[uVar29];
        puVar9[uVar29] = (uint32_t)uVar28;
        puVar46 = (ulong *)(ringbuffer + (local_78 & uVar38));
        uVar33 = 0x7e4;
        if (cVar5 != *(char *)(uVar30 + (long)puVar46)) {
          uVar29 = 0;
          goto LAB_01e36207;
        }
        if ((uVar28 == uVar38) || (uVar29 = uVar28 - uVar38, uVar41 < uVar29)) {
          uVar29 = 0;
          iVar31 = 0;
          uVar41 = uVar30;
        }
        else {
          lVar44 = 0;
          uVar33 = uVar43;
          puVar39 = puVar2;
LAB_01e361dd:
          if (uVar33 < 8) {
            for (uVar41 = 0;
                (uVar33 != uVar41 &&
                (*(char *)((long)puVar46 + uVar41) == *(char *)((long)puVar39 + uVar41)));
                uVar41 = uVar41 + 1) {
            }
          }
          else {
            if (*puVar39 == *puVar46) goto code_r0x01e361ee;
            uVar33 = *puVar46 ^ *puVar39;
            uVar41 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
              }
            }
            uVar41 = uVar41 >> 3 & 0x1fffffff;
          }
          uVar41 = uVar41 - lVar44;
          iVar31 = 0;
          if (3 < uVar41) {
            iVar12 = 0x1f;
            if ((uint)uVar29 != 0) {
              for (; (uint)uVar29 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            uVar33 = (ulong)(iVar12 * -0x1e + 0x780) + uVar41 * 0x87;
            if (0x7e4 < uVar33) goto LAB_01e3645b;
          }
          pHVar10 = (hasher->privat)._H2.common;
          uVar36 = pHVar10->dict_num_lookups;
          local_a0 = pHVar10->dict_num_matches;
          if (local_a0 < uVar36 >> 7) {
            iVar31 = 0;
            uVar33 = 0x7e4;
            uVar29 = 0;
            uVar41 = uVar30;
          }
          else {
            uVar42 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            bVar24 = true;
            uVar33 = 0x7e4;
            iVar31 = 0;
            uVar29 = 0;
            uVar41 = uVar30;
            while (bVar24) {
              uVar36 = uVar36 + 1;
              pHVar10->dict_num_lookups = uVar36;
              bVar23 = pBVar8->hash_table_lengths[uVar42];
              uVar30 = (ulong)bVar23;
              if ((uVar30 != 0) && (uVar30 <= uVar43)) {
                pBVar11 = pBVar8->words;
                puVar39 = (ulong *)(pBVar11->data +
                                   (ulong)pBVar11->offsets_by_length[uVar30] +
                                   pBVar8->hash_table_words[uVar42] * uVar30);
                lVar44 = 0;
                uVar34 = uVar30;
                puVar46 = puVar2;
LAB_01e36350:
                if (uVar34 < 8) {
                  for (uVar34 = 0;
                      ((bVar23 & 7) != uVar34 &&
                      (*(char *)((long)puVar46 + uVar34) == *(char *)((long)puVar39 + uVar34)));
                      uVar34 = uVar34 + 1) {
                  }
                }
                else {
                  if (*puVar39 == *puVar46) goto code_r0x01e36361;
                  uVar37 = *puVar46 ^ *puVar39;
                  uVar34 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                    }
                  }
                  uVar34 = uVar34 >> 3 & 0x1fffffff;
                }
                uVar34 = uVar34 - lVar44;
                if (((uVar34 != 0) && (uVar30 < pBVar8->cutoffTransformsCount + uVar34)) &&
                   (uVar30 = (ulong)pBVar8->hash_table_words[uVar42] + lVar19 + local_d8 +
                             ((ulong)((uint)(pBVar8->cutoffTransforms >>
                                            ((char)(uVar30 - uVar34) * '\x06' & 0x3fU)) & 0x3f) +
                              (uVar30 - uVar34) * 4 << (pBVar11->size_bits_by_length[uVar30] & 0x3f)
                             ), uVar30 <= uVar20)) {
                  iVar12 = 0x1f;
                  if ((uint)uVar30 != 0) {
                    for (; (uint)uVar30 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                    }
                  }
                  uVar37 = (uVar34 * 0x87 - (ulong)(uint)(iVar12 * 0x1e)) + 0x780;
                  if (uVar33 <= uVar37) {
                    iVar31 = (uint)bVar23 - (int)uVar34;
                    local_a0 = local_a0 + 1;
                    pHVar10->dict_num_matches = local_a0;
                    uVar33 = uVar37;
                    uVar29 = uVar30;
                    uVar41 = uVar34;
                  }
                }
              }
              uVar42 = uVar42 + 1;
              bVar24 = false;
            }
          }
        }
      }
LAB_01e3645b:
      if (uVar33 < local_e0 + 0xaf) {
        uVar30 = uVar40;
        uVar29 = uVar21;
        uVar41 = uVar32;
        uVar28 = uVar22;
        iVar31 = local_14c;
        local_d8 = uVar22 + sVar6;
        if (uVar18 <= uVar22 + sVar6) {
          local_d8 = uVar18;
        }
        break;
      }
      uVar30 = uVar45 + 4;
      if (iVar14 == 3) break;
      uVar30 = uVar40 + 1;
      iVar14 = iVar14 + 1;
      uVar36 = uVar22 + 9;
      uVar32 = uVar41;
      uVar40 = uVar30;
      uVar22 = uVar28;
      uVar21 = uVar29;
      local_14c = iVar31;
      local_e0 = uVar33;
    } while (uVar36 < uVar1);
    local_d8 = local_d8 + sVar7;
    if (local_d8 < uVar29) {
LAB_01e3651d:
      uVar40 = uVar29 + 0xf;
LAB_01e36521:
      if ((uVar29 <= local_d8) && (uVar40 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = (int)uVar29;
      }
    }
    else {
      if (uVar29 != (long)*dist_cache) {
        uVar40 = 1;
        if (uVar29 != (long)dist_cache[1]) {
          uVar40 = (uVar29 + 3) - (long)*dist_cache;
          if (uVar40 < 7) {
            bVar23 = (byte)((int)uVar40 << 2);
            uVar38 = 0x9750468;
          }
          else {
            uVar40 = (uVar29 + 3) - (long)dist_cache[1];
            if (6 < uVar40) {
              uVar40 = 2;
              if ((uVar29 != (long)dist_cache[2]) && (uVar40 = 3, uVar29 != (long)dist_cache[3]))
              goto LAB_01e3651d;
              goto LAB_01e36521;
            }
            bVar23 = (byte)((int)uVar40 << 2);
            uVar38 = 0xfdb1ace;
          }
          uVar40 = (ulong)(uVar38 >> (bVar23 & 0x1f) & 0xf);
        }
        goto LAB_01e36521;
      }
      uVar40 = 0;
    }
    uVar38 = (uint)uVar30;
    local_108->insert_len_ = uVar38;
    local_108->copy_len_ = iVar31 << 0x19 | (uint)uVar41;
    uVar22 = (ulong)(params->dist).num_direct_distance_codes;
    uVar45 = uVar22 + 0x10;
    uVar15 = 0;
    if (uVar45 <= uVar40) {
      uVar47 = (params->dist).distance_postfix_bits;
      bVar23 = (byte)uVar47;
      uVar22 = ((4L << (bVar23 & 0x3f)) + (uVar40 - uVar22)) - 0x10;
      uVar35 = 0x1f;
      uVar16 = (uint)uVar22;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar35 == 0; uVar35 = uVar35 - 1) {
        }
      }
      uVar35 = (uVar35 ^ 0xffffffe0) + 0x1f;
      uVar20 = (ulong)((uVar22 >> ((ulong)uVar35 & 0x3f) & 1) != 0);
      lVar44 = (ulong)uVar35 - (ulong)uVar47;
      uVar40 = (~(-1 << (bVar23 & 0x1f)) & uVar16) + uVar45 +
               (uVar20 + lVar44 * 2 + 0xfffe << (bVar23 & 0x3f)) | lVar44 * 0x400;
      uVar15 = (uint32_t)(uVar22 - (uVar20 + 2 << ((byte)uVar35 & 0x3f)) >> (bVar23 & 0x3f));
    }
    local_108->dist_prefix_ = (uint16_t)uVar40;
    local_108->dist_extra_ = uVar15;
    if (5 < uVar30) {
      if (uVar30 < 0x82) {
        uVar38 = 0x1f;
        uVar47 = (uint)(uVar30 - 2);
        if (uVar47 != 0) {
          for (; uVar47 >> uVar38 == 0; uVar38 = uVar38 - 1) {
          }
        }
        uVar38 = (int)(uVar30 - 2 >> ((char)(uVar38 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar38 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (uVar30 < 0x842) {
        uVar47 = 0x1f;
        if (uVar38 - 0x42 != 0) {
          for (; uVar38 - 0x42 >> uVar47 == 0; uVar47 = uVar47 - 1) {
          }
        }
        uVar38 = (uVar47 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar38 = 0x15;
        if (0x1841 < uVar30) {
          uVar38 = (uint)(ushort)(0x17 - (uVar30 < 0x5842));
        }
      }
    }
    uVar47 = iVar31 + (uint)uVar41;
    if (uVar47 < 10) {
      uVar35 = uVar47 - 2;
    }
    else if (uVar47 < 0x86) {
      uVar47 = uVar47 - 6;
      uVar35 = 0x1f;
      if (uVar47 != 0) {
        for (; uVar47 >> uVar35 == 0; uVar35 = uVar35 - 1) {
        }
      }
      uVar35 = (uVar47 >> ((char)(uVar35 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar35 ^ 0xffffffe0) * 2
               + 0x42;
    }
    else {
      uVar35 = 0x17;
      if (uVar47 < 0x846) {
        uVar35 = 0x1f;
        if (uVar47 - 0x46 != 0) {
          for (; uVar47 - 0x46 >> uVar35 == 0; uVar35 = uVar35 - 1) {
          }
        }
        uVar35 = (uVar35 ^ 0xffe0) + 0x2c;
      }
    }
    uVar13 = (ushort)uVar35;
    uVar25 = (uVar13 & 7) + ((ushort)uVar38 & 7) * 8;
    if ((((uVar40 & 0x3ff) == 0) && ((ushort)uVar38 < 8)) && (uVar13 < 0x10)) {
      if (7 < uVar13) {
        uVar25 = uVar25 + 0x40;
      }
    }
    else {
      iVar17 = ((uVar38 & 0xffff) >> 3) * 3 + ((uVar35 & 0xffff) >> 3);
      uVar25 = uVar25 + ((ushort)(0x520d40 >> ((char)iVar17 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar17 * 0x40 + 0x40;
    }
    local_108->cmd_prefix_ = uVar25;
    *num_literals = *num_literals + uVar30;
    position = uVar28 + uVar41;
    uVar45 = sVar26;
    if (position < sVar26) {
      uVar45 = position;
    }
    uVar22 = uVar28 + 2;
    if (uVar29 < uVar41 >> 2) {
      uVar40 = position + uVar29 * -4;
      if (uVar40 < uVar22) {
        uVar40 = uVar22;
      }
      uVar22 = uVar40;
      if (uVar45 < uVar40) {
        uVar22 = uVar45;
      }
    }
    uVar40 = uVar41 * 2 + uVar28 + lVar27;
    local_108 = local_108 + 1;
    for (; uVar22 < uVar45; uVar22 = uVar22 + 1) {
      puVar9[(ulong)(*(long *)(ringbuffer + (uVar22 & ringbuffer_mask)) * 0x7bd3579bd3000000) >>
             0x30] = (uint32_t)uVar22;
    }
    uVar45 = 0;
  } while( true );
  puVar46 = puVar46 + 1;
  puVar39 = puVar39 + 1;
  uVar29 = uVar29 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_01e35be4;
code_r0x01e35ca5:
  puVar46 = puVar46 + 1;
  puVar39 = puVar39 + 1;
  uVar30 = uVar30 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_01e35c94;
code_r0x01e35df0:
  puVar39 = puVar39 + 1;
  puVar46 = puVar46 + 1;
  uVar33 = uVar33 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_01e35dde;
code_r0x01e3611f:
  puVar39 = puVar39 + 1;
  puVar46 = puVar46 + 1;
  uVar33 = uVar33 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_01e3610e;
code_r0x01e361ee:
  puVar39 = puVar39 + 1;
  puVar46 = puVar46 + 1;
  uVar33 = uVar33 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_01e361dd;
code_r0x01e36361:
  puVar39 = puVar39 + 1;
  puVar46 = puVar46 + 1;
  uVar34 = uVar34 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_01e36350;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}